

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O2

int __thiscall
CVmObjFile::getp_get_mode(CVmObjFile *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  byte bVar1;
  int iVar2;
  undefined4 in_register_00000034;
  
  if (getp_get_mode(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar2 = __cxa_guard_acquire(&getp_get_mode(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                CONCAT44(in_register_00000034,self));
    if (iVar2 != 0) {
      getp_get_mode::desc.min_argc_ = 0;
      getp_get_mode::desc.opt_argc_ = 0;
      getp_get_mode::desc.varargs_ = 0;
      __cxa_guard_release(&getp_get_mode(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,argc,&getp_get_mode::desc);
  if (iVar2 == 0) {
    check_valid_file(this);
    bVar1 = (this->super_CVmObject).ext_[0x14];
    retval->typ = VM_INT;
    *(uint *)&retval->val = (uint)bVar1;
  }
  return 1;
}

Assistant:

int CVmObjFile::getp_get_mode(VMG_ vm_obj_id_t self, vm_val_t *retval,
                              uint *argc)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* make sure we are allowed to perform operations on the file */
    check_valid_file(vmg0_);

    /* return the mode */
    retval->set_int(get_ext()->mode);

    /* handled */
    return TRUE;
}